

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ap_str.c
# Opt level: O1

char * ap_str_shrink_spaces(char *str)

{
  bool bVar1;
  char *in_RAX;
  size_t sVar2;
  char *__s;
  size_t sVar3;
  char *local_38;
  
  bVar1 = false;
  local_38 = in_RAX;
  while( true ) {
    sVar2 = strlen(str);
    __s = ap_str_find_first_char_from_set(str,"\t ");
    if (__s == (char *)0x0) break;
    sVar3 = strspn(__s,"\t ");
    if (sVar3 < 2) break;
    memmove(__s + 1,__s + sVar3,(size_t)(str + (sVar2 - (long)(__s + sVar3)) + 1));
    if (!bVar1) {
      local_38 = str;
    }
    bVar1 = true;
    str = __s + 1;
  }
  if (bVar1) {
    str = local_38;
  }
  return str;
}

Assistant:

char * ap_str_shrink_spaces (char *str)
{
	size_t seg_len = 0;
	size_t str_len = strlen (str);

	char *pos = ap_str_find_first_char_from_set (str, "\t ");
	if (pos == NULL)
	{
		goto finish;
	}

	seg_len = strspn (pos, "\t ");
	if (seg_len > 1)
	{
		memmove (pos + 1, pos + seg_len, str_len + str - pos - seg_len + 1);

		ap_str_shrink_spaces (pos + 1);
	}

finish:
	return str;
}